

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

int ipv4_normalize(dynbuf *host)

{
  bool bVar1;
  int local_48 [2];
  curl_off_t l;
  int rc;
  CURLcode result;
  uint parts [4];
  char *c;
  int n;
  _Bool done;
  dynbuf *host_local;
  
  bVar1 = false;
  c._0_4_ = 0;
  parts._8_8_ = Curl_dyn_ptr(host);
  memset(&rc,0,0x10);
  l._4_4_ = CURLE_OK;
  if (*(char *)parts._8_8_ == '[') {
    host_local._4_4_ = 3;
  }
  else {
    while (!bVar1) {
      if (*(char *)parts._8_8_ == '0') {
        if (*(char *)(parts._8_8_ + 1) == 'x') {
          parts._8_8_ = parts._8_8_ + 2;
          l._0_4_ = Curl_str_hex((char **)(parts + 2),(curl_off_t *)local_48,0xffffffff);
        }
        else {
          l._0_4_ = Curl_str_octal((char **)(parts + 2),(curl_off_t *)local_48,0xffffffff);
        }
      }
      else {
        l._0_4_ = Curl_str_number((char **)(parts + 2),(curl_off_t *)local_48,0xffffffff);
      }
      if ((int)l != 0) {
        return 1;
      }
      (&rc)[(int)c] = local_48[0];
      if (*(char *)parts._8_8_ == '\0') {
        bVar1 = true;
      }
      else {
        if (*(char *)parts._8_8_ != '.') {
          return 1;
        }
        if ((int)c == 3) {
          return 1;
        }
        c._0_4_ = (int)c + 1;
        parts._8_8_ = parts._8_8_ + 1;
      }
    }
    switch((int)c) {
    case 0:
      Curl_dyn_reset(host);
      l._4_4_ = Curl_dyn_addf(host,"%u.%u.%u.%u",(ulong)((uint)rc >> 0x18),
                              (ulong)((uint)rc >> 0x10 & 0xff),(ulong)((uint)rc >> 8 & 0xff),
                              (ulong)(rc & 0xff));
      break;
    case 1:
      if ((0xff < (uint)rc) || (0xffffff < result)) {
        return 1;
      }
      Curl_dyn_reset(host);
      l._4_4_ = Curl_dyn_addf(host,"%u.%u.%u.%u",(ulong)(uint)rc,(ulong)(result >> 0x10 & 0xff),
                              (ulong)(result >> 8 & 0xff),(ulong)(result & 0xff));
      break;
    case 2:
      if (((0xff < (uint)rc) || (0xff < result)) || (0xffff < parts[0])) {
        return 1;
      }
      Curl_dyn_reset(host);
      l._4_4_ = Curl_dyn_addf(host,"%u.%u.%u.%u",(ulong)(uint)rc,(ulong)result,
                              (ulong)(parts[0] >> 8 & 0xff),(ulong)(parts[0] & 0xff));
      break;
    case 3:
      if ((((0xff < (uint)rc) || (0xff < result)) || (0xff < parts[0])) || (0xff < parts[1])) {
        return 1;
      }
      Curl_dyn_reset(host);
      l._4_4_ = Curl_dyn_addf(host,"%u.%u.%u.%u",(ulong)(uint)rc,(ulong)result,(ulong)parts[0],
                              (ulong)parts[1]);
    }
    if (l._4_4_ == CURLE_OK) {
      host_local._4_4_ = 2;
    }
    else {
      host_local._4_4_ = -1;
    }
  }
  return host_local._4_4_;
}

Assistant:

static int ipv4_normalize(struct dynbuf *host)
{
  bool done = FALSE;
  int n = 0;
  const char *c = Curl_dyn_ptr(host);
  unsigned int parts[4] = {0, 0, 0, 0};
  CURLcode result = CURLE_OK;

  if(*c == '[')
    return HOST_IPV6;

  while(!done) {
    int rc;
    curl_off_t l;
    if(*c == '0') {
      if(c[1] == 'x') {
        c += 2; /* skip the prefix */
        rc = Curl_str_hex(&c, &l, UINT_MAX);
      }
      else
        rc = Curl_str_octal(&c, &l, UINT_MAX);
    }
    else
      rc = Curl_str_number(&c, &l, UINT_MAX);

    if(rc)
      return HOST_NAME;

    parts[n] = (unsigned int)l;

    switch(*c) {
    case '.':
      if(n == 3)
        return HOST_NAME;
      n++;
      c++;
      break;

    case '\0':
      done = TRUE;
      break;

    default:
      return HOST_NAME;
    }
  }

  switch(n) {
  case 0: /* a -- 32 bits */
    Curl_dyn_reset(host);

    result = Curl_dyn_addf(host, "%u.%u.%u.%u",
                           (parts[0] >> 24),
                           ((parts[0] >> 16) & 0xff),
                           ((parts[0] >> 8) & 0xff),
                           (parts[0] & 0xff));
    break;
  case 1: /* a.b -- 8.24 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xffffff))
      return HOST_NAME;
    Curl_dyn_reset(host);
    result = Curl_dyn_addf(host, "%u.%u.%u.%u",
                           (parts[0]),
                           ((parts[1] >> 16) & 0xff),
                           ((parts[1] >> 8) & 0xff),
                           (parts[1] & 0xff));
    break;
  case 2: /* a.b.c -- 8.8.16 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xffff))
      return HOST_NAME;
    Curl_dyn_reset(host);
    result = Curl_dyn_addf(host, "%u.%u.%u.%u",
                           (parts[0]),
                           (parts[1]),
                           ((parts[2] >> 8) & 0xff),
                           (parts[2] & 0xff));
    break;
  case 3: /* a.b.c.d -- 8.8.8.8 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xff) ||
       (parts[3] > 0xff))
      return HOST_NAME;
    Curl_dyn_reset(host);
    result = Curl_dyn_addf(host, "%u.%u.%u.%u",
                           (parts[0]),
                           (parts[1]),
                           (parts[2]),
                           (parts[3]));
    break;
  }
  if(result)
    return HOST_ERROR;
  return HOST_IPV4;
}